

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O3

void __thiscall
Js::TypedArray<double,_false,_false>::SortHelper
          (TypedArray<double,_false,_false> *this,byte *listBuffer,uint32 length,
          RecyclableObject *compareFn,ScriptContext *scriptContext,ArenaAllocator *allocator)

{
  undefined1 local_48 [8];
  CompareVarsInfo cvInfo;
  
  cvInfo.scriptContext = (ScriptContext *)0x0;
  local_48 = (undefined1  [8])scriptContext;
  Memory::Recycler::WBSetBit((char *)&cvInfo);
  cvInfo.scriptContext = (ScriptContext *)compareFn;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&cvInfo);
  cvInfo.compFn.ptr = (RecyclableObject *)TypedArrayCompareElementsHelper<double>;
  JavascriptArray::TypedArraySort<double>
            ((double *)listBuffer,length,(CompareVarsInfo *)local_48,allocator);
  return;
}

Assistant:

void SortHelper(byte* listBuffer, uint32 length, RecyclableObject* compareFn, ScriptContext* scriptContext, ArenaAllocator* allocator)
        {
            TypeName* list = reinterpret_cast<TypeName*>(listBuffer);
            JavascriptArray::CompareVarsInfo cvInfo;
            cvInfo.scriptContext = scriptContext;
            cvInfo.compFn = compareFn;
            cvInfo.compareType = &TypedArrayCompareElementsHelper<TypeName>;
            JavascriptArray::TypedArraySort<TypeName>(list, length, &cvInfo, allocator);
        }